

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_die.cc
# Opt level: O2

void __thiscall
pstack::Dwarf::DIE::Children::const_iterator::const_iterator
          (const_iterator *this,DIE *first,DIE *parent_)

{
  element_type *peVar1;
  
  (this->u).super___shared_ptr<const_pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->u).super___shared_ptr<const_pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  DIE(&this->parent,parent_);
  DIE(&this->currentDIE,first);
  peVar1 = (this->currentDIE).raw.
           super___shared_ptr<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (((peVar1 != (element_type *)0x0) &&
      ((this->parent).raw.super___shared_ptr<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr != (element_type *)0x0)) && (peVar1->parent == 0)) {
    peVar1->parent = (this->parent).offset;
  }
  return;
}

Assistant:

DIE::Children::const_iterator::const_iterator(const DIE &first, const DIE & parent_)
    : parent(parent_)
    , currentDIE(first)
{
    // As above, take the opportunity to update the current DIE's parent field
    // if it has not already been decided.
    if (currentDIE && parent && currentDIE.raw->parent == 0)
        currentDIE.raw->parent = parent.offset;
}